

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O2

StrokeData * __thiscall
lunasvg::SVGGraphicsElement::getStrokeData
          (StrokeData *__return_storage_ptr__,SVGGraphicsElement *this,SVGLayoutState *state)

{
  pointer pLVar1;
  Length *dash;
  pointer length;
  float fVar2;
  float local_8c;
  DashArray *local_88;
  StrokeData *local_80;
  DashArray dashArray;
  LengthContext lengthContext;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  lengthContext.m_units = UserSpaceOnUse;
  lengthContext.m_element = &this->super_SVGElement;
  fVar2 = LengthContext::valueForLength(&lengthContext,&state->m_stroke_width,Diagonal);
  __return_storage_ptr__->m_lineWidth = fVar2;
  __return_storage_ptr__->m_dashOffset = 0.0;
  local_88 = &__return_storage_ptr__->m_dashArray;
  (__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->m_miterLimit = state->m_stroke_miterlimit;
  __return_storage_ptr__->m_lineCap = state->m_stroke_linecap;
  __return_storage_ptr__->m_lineJoin = state->m_stroke_linejoin;
  fVar2 = LengthContext::valueForLength(&lengthContext,&state->m_stroke_dashoffset,Diagonal);
  __return_storage_ptr__->m_dashOffset = fVar2;
  dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pLVar1 = (state->m_stroke_dasharray).
           super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_80 = __return_storage_ptr__;
  for (length = (state->m_stroke_dasharray).
                super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
                super__Vector_impl_data._M_start; length != pLVar1; length = length + 1) {
    local_8c = LengthContext::valueForLength(&lengthContext,length,Diagonal);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&dashArray,&local_8c);
  }
  local_48._M_impl.super__Vector_impl_data._M_start =
       dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::_M_move_assign(local_88,&local_48);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&dashArray.super__Vector_base<float,_std::allocator<float>_>);
  return local_80;
}

Assistant:

StrokeData SVGGraphicsElement::getStrokeData(const SVGLayoutState& state) const
{
    LengthContext lengthContext(this);
    StrokeData strokeData(lengthContext.valueForLength(state.stroke_width(), LengthDirection::Diagonal));
    strokeData.setMiterLimit(state.stroke_miterlimit());
    strokeData.setLineCap(state.stroke_linecap());
    strokeData.setLineJoin(state.stroke_linejoin());
    strokeData.setDashOffset(lengthContext.valueForLength(state.stroke_dashoffset(), LengthDirection::Diagonal));

    DashArray dashArray;
    for(const auto& dash : state.stroke_dasharray())
        dashArray.push_back(lengthContext.valueForLength(dash, LengthDirection::Diagonal));
    strokeData.setDashArray(std::move(dashArray));
    return strokeData;
}